

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzhyperplane.cpp
# Opt level: O2

REAL __thiscall
TPZHyperPlaneIntersect::EdgeIntersect
          (TPZHyperPlaneIntersect *this,TPZGeoElSide *gelside,TPZHyperPlane *plane)

{
  REAL RVar1;
  double *pdVar2;
  int i;
  long col;
  uint uVar3;
  double local_2e8;
  double local_2d8;
  TPZManVector<double,_1> edgeparam;
  REAL detjac;
  TPZManVector<double,_3> X;
  TPZManVector<double,_3> planejac;
  TPZFNMatrix<1,_double> edgejac;
  TPZFNMatrix<3,_double> axes;
  TPZFNMatrix<1,_double> jacinv;
  
  axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_1>::TPZManVector(&edgeparam,1,(double *)&axes);
  TPZManVector<double,_3>::TPZManVector(&planejac,3);
  TPZManVector<double,_3>::TPZManVector(&X,3);
  TPZGeoElSide::X(gelside,&edgeparam.super_TPZVec<double>,&X.super_TPZVec<double>);
  local_2d8 = TPZHyperPlane::Distance(plane,&X.super_TPZVec<double>,&planejac.super_TPZVec<double>);
  for (uVar3 = 0; (1e-06 < ABS(local_2d8) && (uVar3 < 5)); uVar3 = uVar3 + 1) {
    TPZFNMatrix<1,_double>::TPZFNMatrix(&edgejac,1,1);
    TPZFNMatrix<1,_double>::TPZFNMatrix(&jacinv,1,1);
    TPZFNMatrix<3,_double>::TPZFNMatrix(&axes,1,3);
    TPZGeoElSide::Jacobian
              (gelside,&edgeparam.super_TPZVec<double>,&edgejac.super_TPZFMatrix<double>,
               &axes.super_TPZFMatrix<double>,&detjac,&jacinv.super_TPZFMatrix<double>);
    local_2e8 = 0.0;
    for (col = 0; col != 3; col = col + 1) {
      pdVar2 = TPZFMatrix<double>::operator()(&axes.super_TPZFMatrix<double>,0,col);
      local_2e8 = local_2e8 + *pdVar2 * planejac.super_TPZVec<double>.fStore[col];
    }
    pdVar2 = TPZFMatrix<double>::operator()(&jacinv.super_TPZFMatrix<double>,0,0);
    *edgeparam.super_TPZVec<double>.fStore =
         *edgeparam.super_TPZVec<double>.fStore - (local_2d8 * *pdVar2) / local_2e8;
    TPZGeoElSide::X(gelside,&edgeparam.super_TPZVec<double>,&X.super_TPZVec<double>);
    local_2d8 = TPZHyperPlane::Distance
                          (plane,&X.super_TPZVec<double>,&planejac.super_TPZVec<double>);
    TPZFNMatrix<3,_double>::~TPZFNMatrix(&axes);
    TPZFNMatrix<1,_double>::~TPZFNMatrix(&jacinv);
    TPZFNMatrix<1,_double>::~TPZFNMatrix(&edgejac);
  }
  if (uVar3 == 5) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzhyperplane.cpp"
               ,0xec);
  }
  RVar1 = *edgeparam.super_TPZVec<double>.fStore;
  TPZManVector<double,_3>::~TPZManVector(&X);
  TPZManVector<double,_3>::~TPZManVector(&planejac);
  TPZManVector<double,_1>::~TPZManVector(&edgeparam);
  return RVar1;
}

Assistant:

REAL TPZHyperPlaneIntersect::EdgeIntersect(const TPZGeoElSide &gelside, const TPZHyperPlane &plane)
{
    TPZManVector<REAL, 1> edgeparam(1,0.);
    TPZManVector<REAL,3> planejac(3), X(3);
    gelside.X(edgeparam, X);
    REAL distance = plane.Distance(X,planejac);
    int niter = 0;
    while (std::abs(distance) > 1.e-6 && niter < 5) {
        TPZFNMatrix<1,REAL> edgejac(1,1), jacinv(1,1);
        TPZFNMatrix<3,REAL> axes(1,3);
        REAL detjac;
        gelside.Jacobian(edgeparam,edgejac, axes, detjac, jacinv);
        REAL inner = 0;
        for (int i=0; i<3; i++) {
            inner += axes(0,i)*planejac[i];
        }
        edgeparam[0] -= jacinv(0,0)*distance/inner;
        gelside.X(edgeparam, X);
        distance = plane.Distance(X, planejac);
        niter++;
    }
    if (niter == 5) {
        DebugStop();
    }
    return edgeparam[0];
}